

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O3

void speak_file_to_file(OpenJTalk *openjtalk,FILE *fp)

{
  char cVar1;
  int iVar2;
  char *p;
  char *__s;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  char line [260];
  char local_138 [264];
  
  if (fp != (FILE *)0x0) {
    iVar2 = getc((FILE *)fp);
    if ((((char)iVar2 != -0x11) || (iVar2 = getc((FILE *)fp), (char)iVar2 != -0x45)) ||
       (iVar2 = getc((FILE *)fp), (char)iVar2 != -0x41)) {
      fseek((FILE *)fp,0,0);
    }
    __s = (char *)malloc(0x105);
    *__s = '\0';
    while (pcVar3 = fgets(local_138,0x104,(FILE *)fp), pcVar4 = local_138, pcVar3 != (char *)0x0) {
      for (; cVar1 = *pcVar4, cVar1 != '\0'; pcVar4 = pcVar4 + 1) {
        if ((cVar1 == '\n') || (cVar1 == '\r')) {
          *pcVar4 = '\0';
          break;
        }
      }
      sVar5 = strlen(local_138);
      if (sVar5 != 0) {
        sVar6 = strlen(__s);
        __s = (char *)realloc(__s,(ulong)(sVar6 != 0) + sVar5 + sVar6 + 1);
        if (sVar6 != 0) {
          sVar5 = strlen(__s);
          (__s + sVar5)[0] = ' ';
          (__s + sVar5)[1] = '\0';
        }
        strcat(__s,local_138);
      }
    }
    openjtalk_speakToFile(openjtalk,__s,outfile);
  }
  return;
}

Assistant:

void speak_file_to_file(OpenJTalk *openjtalk, FILE *fp)
{
	if (fp == NULL)
	{
		return;
	}

	if ((getc(fp) & 0xFF) != 0xEF || (getc(fp) & 0xFF) != 0xBB || (getc(fp) & 0xFF) != 0xBF)
	{
		fseek(fp, 0, SEEK_SET);
	}

	char *str = (char*)malloc(sizeof(char)*MAX_PATH + 1);
	strcpy(str, "");

	char line[MAX_PATH];
	while (fgets(line, MAX_PATH, fp) != NULL)
	{
		remove_cr_lf(line);
		if (strlen(line) == 0)
		{
			continue;
		}

		size_t len = strlen(str);
		str = (char*)realloc(str, len + (len>0 ? 1 : 0) + strlen(line) + 1);
		if (len > 0)
		{
			strcat(str, " ");
		}
		strcat(str, line);
	}

	openjtalk_speakToFile(openjtalk, str, outfile);
}